

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O3

NearestNeighborsIndex * __thiscall
CoreML::Specification::NearestNeighborsIndex::New(NearestNeighborsIndex *this,Arena *arena)

{
  NearestNeighborsIndex *this_00;
  
  this_00 = (NearestNeighborsIndex *)operator_new(0x50);
  NearestNeighborsIndex(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::NearestNeighborsIndex>(arena,this_00);
  }
  return this_00;
}

Assistant:

NearestNeighborsIndex* NearestNeighborsIndex::New(::google::protobuf::Arena* arena) const {
  NearestNeighborsIndex* n = new NearestNeighborsIndex;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}